

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser_test.cpp
# Opt level: O2

void __thiscall
http_response_parsing_smoke02_Test::TestBody(http_response_parsing_smoke02_Test *this)

{
  char *in_R9;
  AssertHelper AStack_a8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  string local_98;
  AssertionResult gtest_ar_;
  sub_string str;
  http_response response;
  
  str = sub_string::literal<903ul>
                  ((char (*) [903])
                   "HTTP/1.1 200 OK\r\nDate: Wed, 23 Dec 2015 13:43:56 GMT\r\nServer: Server\r\nSet-Cookie: skin=noskin; path=/; domain=.amazon.com\r\npragma: no-cache\r\nx-amz-id-1: 0WDRFNYP6K3XJ8VGHRBQ\r\np3p: policyref=\"https://www.amazon.com/w3c/p3p.xml\",CP=\"CAO DSP LAW CUR ADM IVAo IVDo CONo OTPo OUR DELi PUBi OTRi BUS PHY ONL UNI PUR FIN COM NAV INT DEM CNT STA HEA PRE LOC GOV OTC \"\r\ncache-control: no-cache\r\nx-frame-options: SAMEORIGIN\r\nexpires: -1\r\nVary: Accept-Encoding,User-Agent,Avail-Dictionary\r\nContent-Encoding: gzip\r\nContent-Type: text/html; charset=UTF-8\r\nSet-cookie: ubid-main=190-5441568-7691748; path=/; domain=.amazon.com; expires=Tue, 01-Jan-2036 08:00:01 GMT\r\nSet-cookie: session-id-time=2082787201l; path=/; domain=.amazon.com; expires=Tue, 01-Jan-2036 08:00:01 GMT\r\nSet-cookie: session-id=178-4697370-5690842; path=/; domain=.amazon.com; expires=Tue, 01-Jan-2036 08:00:01 GMT\r\nTransfer-Encoding: chunked\r\n\r\n"
                  );
  parse_response(&response,&str);
  gtest_ar_.success_ = sub_string::empty(&str);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&gtest_ar_,(AssertionResult *)0x1420b9,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/http_parser_test.cpp"
               ,0xea,local_98._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_a8,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_a8);
    std::__cxx11::string::~string((string *)&local_98);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&response.headers._M_t);
  return;
}

Assistant:

TEST(http_response_parsing, smoke02)
{
    sub_string str = sub_string::literal(
        "HTTP/1.1 200 OK" "\r\n"
        "Date: Wed, 23 Dec 2015 13:43:56 GMT" "\r\n"
        "Server: Server" "\r\n"
        "Set-Cookie: skin=noskin; path=/; domain=.amazon.com" "\r\n"
        "pragma: no-cache" "\r\n"
        "x-amz-id-1: 0WDRFNYP6K3XJ8VGHRBQ" "\r\n"
        "p3p: policyref=\"https://www.amazon.com/w3c/p3p.xml\",CP=\"CAO DSP LAW CUR ADM IVAo IVDo CONo OTPo OUR DELi PUBi OTRi BUS PHY ONL UNI PUR FIN COM NAV INT DEM CNT STA HEA PRE LOC GOV OTC \"" "\r\n"
        "cache-control: no-cache" "\r\n"
        "x-frame-options: SAMEORIGIN" "\r\n"
        "expires: -1" "\r\n"
        "Vary: Accept-Encoding,User-Agent,Avail-Dictionary" "\r\n"
        "Content-Encoding: gzip" "\r\n"
        "Content-Type: text/html; charset=UTF-8" "\r\n"
        "Set-cookie: ubid-main=190-5441568-7691748; path=/; domain=.amazon.com; expires=Tue, 01-Jan-2036 08:00:01 GMT" "\r\n"
        "Set-cookie: session-id-time=2082787201l; path=/; domain=.amazon.com; expires=Tue, 01-Jan-2036 08:00:01 GMT" "\r\n"
        "Set-cookie: session-id=178-4697370-5690842; path=/; domain=.amazon.com; expires=Tue, 01-Jan-2036 08:00:01 GMT" "\r\n"
        "Transfer-Encoding: chunked" "\r\n"
        "\r\n");
    http_response response = parse_response(str);
    EXPECT_TRUE(str.empty());
}